

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

SubControl __thiscall QScrollBarPrivate::newHoverControl(QScrollBarPrivate *this,QPoint *pos)

{
  SubControl SVar1;
  QScrollBar *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RSI;
  QScrollBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QScrollBar *q;
  QStyleOptionSlider opt;
  undefined4 in_stack_ffffffffffffff28;
  SubControl in_stack_ffffffffffffff2c;
  undefined8 local_9c;
  undefined8 local_94;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  memcpy(local_88,&DAT_00b21f40,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x67aeba);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractSlider).super_QWidget + 0x1a8))(pQVar2,local_88);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)in_RDI,in_stack_ffffffffffffff2c)
  ;
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  SVar1 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,2,local_88,in_RSI,pQVar2);
  in_RDI->hoverControl = SVar1;
  if (in_RDI->hoverControl == SC_None) {
    QRect::QRect((QRect *)in_RDI);
    (in_RDI->hoverRect).x1 = (Representation)(undefined4)local_9c;
    (in_RDI->hoverRect).y1 = (Representation)local_9c._4_4_;
    (in_RDI->hoverRect).x2 = (Representation)(undefined4)local_94;
    (in_RDI->hoverRect).y2 = (Representation)local_94._4_4_;
  }
  else {
    pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))
                             (pQVar3,2,local_88,in_RDI->hoverControl,pQVar2);
    in_RDI->hoverRect = QVar4;
  }
  SVar1 = in_RDI->hoverControl;
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x67afc3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QScrollBarPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt, hoverControl, q);
    return hoverControl;
}